

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O0

string * cmSearchPathStripBin(string *__return_storage_ptr__,string *s)

{
  string_view sVar1;
  bool bVar2;
  string *s_local;
  
  sVar1 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)s);
  bVar2 = cmHasLiteralSuffix<5ul>(sVar1,(char (*) [5])0xfb1b1c);
  if (!bVar2) {
    sVar1 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)s);
    bVar2 = cmHasLiteralSuffix<6ul>(sVar1,(char (*) [6])0xff86a6);
    if (!bVar2) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
      return __return_storage_ptr__;
    }
  }
  cmsys::SystemTools::GetFilenamePath(__return_storage_ptr__,s);
  return __return_storage_ptr__;
}

Assistant:

static std::string cmSearchPathStripBin(std::string const& s)
{
  // If the path is a PREFIX/bin case then add its parent instead.
  if ((cmHasLiteralSuffix(s, "/bin")) || (cmHasLiteralSuffix(s, "/sbin"))) {
    return cmSystemTools::GetFilenamePath(s);
  }
  return s;
}